

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

Node * __thiscall
mapbox::detail::Earcut<long>::
linkedList<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
          (Earcut<long> *this,
          vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          *points,bool clockwise)

{
  plain_array<double,_2,_1,_16> *ppVar1;
  double dVar2;
  pointer pMVar3;
  pointer pMVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *last;
  long lVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pMVar3 = (points->
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar4 = (points->
           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)pMVar4 - (long)pMVar3 >> 4;
  if (pMVar4 != pMVar3) {
    lVar7 = 0;
    if (lVar10 != 0) {
      lVar7 = lVar10 + -1;
    }
    lVar8 = lVar10 + (ulong)(lVar10 == 0);
    pdVar9 = (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array + 1;
    dVar11 = 0.0;
    dVar12 = pMVar3[lVar7].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
             m_data.array[1];
    dVar13 = pMVar3[lVar7].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
             m_data.array[0];
    do {
      ppVar1 = (plain_array<double,_2,_1,_16> *)(pdVar9 + -1);
      dVar2 = *pdVar9;
      dVar11 = dVar11 + (dVar12 + dVar2) * (dVar13 - ppVar1->array[0]);
      pdVar9 = pdVar9 + 2;
      lVar8 = lVar8 + -1;
      dVar12 = dVar2;
      dVar13 = ppVar1->array[0];
    } while (lVar8 != 0);
    if (dVar11 <= 0.0 == clockwise) {
      if (pMVar4 != pMVar3) {
        last = (Node *)0x0;
        lVar8 = lVar10 << 4;
        lVar7 = lVar10;
        do {
          lVar7 = lVar7 + -1;
          last = insertNode<Eigen::Matrix<double,1,2,1,1,2>>
                           (this,this->vertices + lVar7,
                            (Matrix<double,_1,_2,_1,_1,_2> *)
                            ((long)&(points->
                                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[-1].
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.
                                    m_storage.m_data + lVar8),last);
          lVar8 = lVar8 + -0x10;
        } while (lVar7 != 0);
        goto LAB_0019dd14;
      }
    }
    else if (pMVar4 != pMVar3) {
      lVar8 = 0;
      lVar7 = 0;
      last = (Node *)0x0;
      do {
        last = insertNode<Eigen::Matrix<double,1,2,1,1,2>>
                         (this,this->vertices + lVar7,
                          (Matrix<double,_1,_2,_1,_1,_2> *)
                          ((long)&(((points->
                                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                                  m_storage.m_data + lVar8),last);
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x10;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar7);
LAB_0019dd14:
      if (last != (Node *)0x0) {
        pNVar5 = last->next;
        if ((last->x == pNVar5->x) && (!NAN(last->x) && !NAN(pNVar5->x))) {
          if ((last->y == pNVar5->y) && (!NAN(last->y) && !NAN(pNVar5->y))) {
            pNVar6 = last->prev;
            pNVar5->prev = pNVar6;
            pNVar6->next = pNVar5;
            pNVar5 = last->prevZ;
            pNVar6 = last->nextZ;
            if (pNVar5 != (Node *)0x0) {
              pNVar5->nextZ = pNVar6;
            }
            if (pNVar6 != (Node *)0x0) {
              pNVar6->prevZ = pNVar5;
            }
            last = last->next;
          }
        }
        goto LAB_0019dd67;
      }
    }
  }
  last = (Node *)0x0;
LAB_0019dd67:
  this->vertices = this->vertices + lVar10;
  return last;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::linkedList(const Ring& points, const bool clockwise) {
    using Point = typename Ring::value_type;
    double sum = 0;
    const std::size_t len = points.size();
    std::size_t i, j;
    Node* last = nullptr;

    // calculate original winding order of a polygon ring
    for (i = 0, j = len > 0 ? len - 1 : 0; i < len; j = i++) {
        const auto& p1 = points[i];
        const auto& p2 = points[j];
        const double p20 = util::nth<0, Point>::get(p2);
        const double p10 = util::nth<0, Point>::get(p1);
        const double p11 = util::nth<1, Point>::get(p1);
        const double p21 = util::nth<1, Point>::get(p2);
        sum += (p20 - p10) * (p11 + p21);
    }

    // link points into circular doubly-linked list in the specified winding order
    if (clockwise == (sum > 0)) {
        for (i = 0; i < len; i++) last = insertNode(vertices + i, points[i], last);
    } else {
        for (i = len; i-- > 0;) last = insertNode(vertices + i, points[i], last);
    }

    if (last && equals(last, last->next)) {
        removeNode(last);
        last = last->next;
    }

    vertices += len;

    return last;
}